

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task.hpp
# Opt level: O0

Task * __thiscall tf::Task::succeed<tf::Task&>(Task *this,Task *tasks)

{
  Task *in_RDI;
  
  Node::_precede((Node *)this,(Node *)tasks);
  return in_RDI;
}

Assistant:

Task& Task::succeed(Ts&&... tasks) {
  (tasks._node->_precede(_node), ...);
  //_succeed(std::forward<Ts>(tasks)...);
  return *this;
}